

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::OutOfRangeException::OutOfRangeException<short,short>
          (OutOfRangeException *this,string *msg,short params,short params_1)

{
  undefined6 in_register_00000012;
  short in_R8W;
  string local_30;
  
  Exception::ConstructMessage<short,short>
            (&local_30,(Exception *)msg,(string *)CONCAT62(in_register_00000012,params),params_1,
             in_R8W);
  OutOfRangeException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit OutOfRangeException(const string &msg, ARGS... params)
	    : OutOfRangeException(ConstructMessage(msg, params...)) {
	}